

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

void jpeg_save_markers(j_decompress_ptr cinfo,int marker_code,uint length_limit)

{
  jpeg_marker_reader *pjVar1;
  jpeg_error_mgr *pjVar2;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  lVar6 = cinfo->mem->max_alloc_chunk + -0x20;
  uVar5 = (uint)lVar6;
  if ((long)(ulong)length_limit <= lVar6) {
    uVar5 = length_limit;
  }
  if (uVar5 == 0) {
    pcVar3 = skip_variable;
    if (marker_code == 0xee) {
      pcVar3 = get_interesting_appn;
    }
    if (marker_code == 0xe0) {
      pcVar3 = get_interesting_appn;
    }
    uVar4 = 0;
  }
  else {
    pcVar3 = save_marker;
    if ((marker_code != 0xe0) || (uVar4 = 0xe, 0xd < uVar5)) {
      uVar4 = 0xc;
      if (0xc < uVar5) {
        uVar4 = uVar5;
      }
      if (marker_code != 0xee) {
        uVar4 = uVar5;
      }
    }
  }
  pjVar1 = cinfo->marker;
  if (marker_code != 0xfe) {
    if ((marker_code & 0xfffffff0U) != 0xe0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x44;
      (pjVar2->msg_parm).i[0] = marker_code;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      return;
    }
    (&pjVar1[1].read_markers)[marker_code - 0xe0] = pcVar3;
    *(uint *)((long)&pjVar1[4].read_restart_marker + (ulong)(marker_code - 0xe0) * 4 + 4) = uVar4;
    return;
  }
  pjVar1[1].reset_marker_reader = pcVar3;
  *(uint *)&pjVar1[4].read_restart_marker = uVar4;
  return;
}

Assistant:

GLOBAL(void)
jpeg_save_markers(j_decompress_ptr cinfo, int marker_code,
                  unsigned int length_limit)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  long maxlength;
  jpeg_marker_parser_method processor;

  /* Length limit mustn't be larger than what we can allocate
   * (should only be a concern in a 16-bit environment).
   */
  maxlength = cinfo->mem->max_alloc_chunk - sizeof(struct jpeg_marker_struct);
  if (((long)length_limit) > maxlength)
    length_limit = (unsigned int)maxlength;

  /* Choose processor routine to use.
   * APP0/APP14 have special requirements.
   */
  if (length_limit) {
    processor = save_marker;
    /* If saving APP0/APP14, save at least enough for our internal use. */
    if (marker_code == (int)M_APP0 && length_limit < APP0_DATA_LEN)
      length_limit = APP0_DATA_LEN;
    else if (marker_code == (int)M_APP14 && length_limit < APP14_DATA_LEN)
      length_limit = APP14_DATA_LEN;
  } else {
    processor = skip_variable;
    /* If discarding APP0/APP14, use our regular on-the-fly processor. */
    if (marker_code == (int)M_APP0 || marker_code == (int)M_APP14)
      processor = get_interesting_appn;
  }

  if (marker_code == (int)M_COM) {
    marker->process_COM = processor;
    marker->length_limit_COM = length_limit;
  } else if (marker_code >= (int)M_APP0 && marker_code <= (int)M_APP15) {
    marker->process_APPn[marker_code - (int)M_APP0] = processor;
    marker->length_limit_APPn[marker_code - (int)M_APP0] = length_limit;
  } else
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, marker_code);
}